

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O1

void absl::lts_20250127::base_internal::
     CallOnceImpl<absl::lts_20250127::BadStatusOrAccess::InitWhat()const::__0>
               (Nonnull<std::atomic<uint32_t>_*> control,SchedulingMode scheduling_mode,
               anon_class_8_1_8991fb9c *fn)

{
  __int_type_conflict2 _Var1;
  long lVar2;
  Status *this;
  uint32_t uVar3;
  StatusToStringMode mode;
  undefined4 in_register_00000034;
  bool bVar4;
  string local_b8;
  string local_98;
  undefined8 local_78;
  char *local_70;
  AlphaNum local_48;
  
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((int)_Var1 < 0x5a308d2) {
    if ((_Var1 != 0) && (_Var1 != 0xdd)) {
LAB_004b3796:
      raw_log_internal::RawLog(kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx")
      ;
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/call_once.h"
                    ,0xa4,
                    "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/status/statusor.cc:66:31), Args = <>]"
                   );
    }
  }
  else if ((_Var1 != 0x5a308d2) && (_Var1 != 0x65c2937b)) goto LAB_004b3796;
  mode = 0x65c2937b;
  LOCK();
  bVar4 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
  if (bVar4) {
    (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
  }
  UNLOCK();
  if (!bVar4) {
    mode = kDefault;
    uVar3 = SpinLockWait(control,3,
                         CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/status/statusor.cc:66:31)>
                         ::trans,SCHEDULE_COOPERATIVE_AND_KERNEL);
    if (uVar3 != 0) {
      return;
    }
  }
  lVar2 = *(long *)CONCAT44(in_register_00000034,scheduling_mode);
  local_78 = 0x15;
  local_70 = "Bad StatusOr access: ";
  this = *(Status **)(lVar2 + 8);
  if (this == (Status *)0x1) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8.field_2._M_allocated_capacity._0_2_ = 0x4b4f;
    local_b8._M_string_length = 2;
    local_b8.field_2._M_local_buf[2] = '\0';
  }
  else {
    Status::ToStringSlow_abi_cxx11_(&local_b8,this,1,mode);
  }
  local_48.piece_._M_len = local_b8._M_string_length;
  local_48.piece_._M_str = local_b8._M_dataplus._M_p;
  StrCat_abi_cxx11_(&local_98,(lts_20250127 *)&local_78,&local_48,
                    (AlphaNum *)local_b8._M_string_length);
  std::__cxx11::string::operator=((string *)(lVar2 + 0x18),(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT53(local_b8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_b8.field_2._M_local_buf[2],
                                      local_b8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  LOCK();
  _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
  (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
  UNLOCK();
  if (_Var1 == 0x5a308d2) {
    AbslInternalSpinLockWake_lts_20250127(control,true);
  }
  return;
}

Assistant:

void
    CallOnceImpl(absl::Nonnull<std::atomic<uint32_t>*> control,
                 base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                 Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}